

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall wasm::Output::Output(Output *this,string *filename,BinaryOption binary)

{
  streambuf *psVar1;
  anon_class_48_3_9201d218 local_50;
  BinaryOption local_1c;
  string *psStack_18;
  BinaryOption binary_local;
  string *filename_local;
  Output *this_local;
  
  local_1c = binary;
  psStack_18 = filename;
  filename_local = (string *)this;
  std::ofstream::ofstream(this);
  local_50.this = this;
  std::__cxx11::string::string((string *)&local_50.filename,(string *)psStack_18);
  local_50.binary = local_1c;
  psVar1 = Output::anon_class_48_3_9201d218::operator()(&local_50);
  std::ostream::ostream(&this->out,psVar1);
  Output(std::__cxx11::string_const&,wasm::Flags::BinaryOption)::$_0::~__0((__0 *)&local_50);
  return;
}

Assistant:

wasm::Output::Output(const std::string& filename, Flags::BinaryOption binary)
  : outfile(), out([this, filename, binary]() {
      // Ensure a single return at the very end, to avoid clang-tidy warnings
      // about the types of different returns here.
      std::streambuf* buffer;
      if (filename == "-" || filename.empty()) {
        buffer = std::cout.rdbuf();
      } else {
        BYN_TRACE("Opening '" << filename << "'\n");
        std::ios_base::openmode flags =
          std::ofstream::out | std::ofstream::trunc;
        if (binary == Flags::Binary) {
          flags |= std::ofstream::binary;
        }
        outfile.open(wasm::Path::to_path(filename), flags);
        if (!outfile.is_open()) {
          Fatal() << "Failed opening output file '" << filename
                  << "': " << strerror(errno);
        }
        buffer = outfile.rdbuf();
      }
      return buffer;
    }()) {}